

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapCache::Key>::moveAppend
          (QGenericArrayOps<QPixmapCache::Key> *this,Key *b,Key *e)

{
  Key *pKVar1;
  Key *in_RDX;
  Key *in_RSI;
  long in_RDI;
  Key *data;
  Key *local_10;
  
  if (in_RSI != in_RDX) {
    pKVar1 = QArrayDataPointer<QPixmapCache::Key>::begin
                       ((QArrayDataPointer<QPixmapCache::Key> *)0x32f4a7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPixmapCache::Key::Key(pKVar1 + *(long *)(in_RDI + 0x10),local_10);
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }